

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O1

int properties_set_user_id(PROPERTIES_HANDLE properties,amqp_binary user_id_value)

{
  int iVar1;
  AMQP_VALUE item_value;
  int iVar2;
  PROPERTIES_INSTANCE *properties_instance;
  amqp_binary value;
  
  if (properties == (PROPERTIES_HANDLE)0x0) {
    iVar2 = 0x3f22;
  }
  else {
    value._12_4_ = 0;
    value.bytes = (void *)SUB128(user_id_value._0_12_,0);
    value.length = SUB124(user_id_value._0_12_,8);
    item_value = amqpvalue_create_binary(value);
    if (item_value == (AMQP_VALUE)0x0) {
      iVar2 = 0x3f2a;
    }
    else {
      iVar1 = amqpvalue_set_composite_item(properties->composite_value,1,item_value);
      iVar2 = 0x3f30;
      if (iVar1 == 0) {
        iVar2 = 0;
      }
      amqpvalue_destroy(item_value);
    }
  }
  return iVar2;
}

Assistant:

int properties_set_user_id(PROPERTIES_HANDLE properties, amqp_binary user_id_value)
{
    int result;

    if (properties == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        PROPERTIES_INSTANCE* properties_instance = (PROPERTIES_INSTANCE*)properties;
        AMQP_VALUE user_id_amqp_value = amqpvalue_create_binary(user_id_value);
        if (user_id_amqp_value == NULL)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (amqpvalue_set_composite_item(properties_instance->composite_value, 1, user_id_amqp_value) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }

            amqpvalue_destroy(user_id_amqp_value);
        }
    }

    return result;
}